

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

uchar * __thiscall
kj::Vector<unsigned_char>::add<unsigned_char&>(Vector<unsigned_char> *this,uchar *params)

{
  bool bVar1;
  uchar *puVar2;
  uchar *params_local;
  Vector<unsigned_char> *this_local;
  
  bVar1 = ArrayBuilder<unsigned_char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  puVar2 = fwd<unsigned_char&>(params);
  puVar2 = ArrayBuilder<unsigned_char>::add<unsigned_char&>(&this->builder,puVar2);
  return puVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }